

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O1

Object * __thiscall
chatra::Reference::
allocateWithoutLock<chatra::Object,chatra::TypeId,std::vector<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>,std::allocator<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>>>,std::vector<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>,std::allocator<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>>>,std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&>
          (Reference *this,TypeId *args,
          vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
          *args_1,vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
                  *args_2,
          unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>
          *args_3)

{
  SpinLock *pSVar1;
  iterator *piVar2;
  pointer *pppOVar3;
  __atomic_flag_data_type _Var4;
  TypeId TVar5;
  ReferenceNode *pRVar6;
  Storage *pSVar7;
  Storage *pSVar8;
  _Elt_pointer ppOVar9;
  iterator __position;
  Reference *pRVar10;
  Object *pOVar11;
  _Elt_pointer puVar12;
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b0;
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  local_78;
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  local_58;
  Reference *local_40;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_chatra::StringId,_chatra::Reference>,_false>_>_>
  local_38;
  __alloc_node_gen_t __alloc_node_gen;
  
  local_40 = this;
  pOVar11 = (Object *)operator_new(0xa8);
  TVar5 = *args;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_2->
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_2->
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_h = (__hashtable_alloc *)&local_b0;
  local_b0._M_buckets = (__buckets_ptr)0x0;
  local_b0._M_bucket_count = (args_3->_M_h)._M_bucket_count;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = (args_3->_M_h)._M_element_count;
  local_b0._M_rehash_policy._M_max_load_factor = (args_3->_M_h)._M_rehash_policy._M_max_load_factor;
  local_b0._M_rehash_policy._4_4_ = *(undefined4 *)&(args_3->_M_h)._M_rehash_policy.field_0x4;
  local_b0._M_rehash_policy._M_next_resize = (args_3->_M_h)._M_rehash_policy._M_next_resize;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<chatra::StringId,std::pair<chatra::StringId_const,chatra::Reference>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>,std::__detail::_Select1st,std::equal_to<chatra::StringId>,std::hash<chatra::StringId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<chatra::StringId,std::pair<chatra::StringId_const,chatra::Reference>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>,std::__detail::_Select1st,std::equal_to<chatra::StringId>,std::hash<chatra::StringId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<chatra::StringId_const,chatra::Reference>,false>>>>
            ((_Hashtable<chatra::StringId,std::pair<chatra::StringId_const,chatra::Reference>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>,std::__detail::_Select1st,std::equal_to<chatra::StringId>,std::hash<chatra::StringId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_38._M_h,&args_3->_M_h,&local_38);
  (pOVar11->super_Lockable).lockRequester._M_i = 0xffffffffffffffff;
  (pOVar11->super_Lockable).lockCount = 0;
  pOVar11->_vptr_Object = (_func_int **)&PTR__Object_00246b78;
  *(TypeId *)&(pOVar11->super_Lockable).field_0xc = TVar5;
  pOVar11->objectIndex = 0xffffffffffffffff;
  pOVar11->gcGeneration = 0;
  (pOVar11->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pOVar11->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pOVar11->groups).
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar11->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pOVar11->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pOVar11->nodes).
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(pOVar11->refsMap)._M_h,&local_b0,&local_b0);
  (pOVar11->refsArray).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar11->refsArray).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar11->refsArray).super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&local_78);
  pRVar10 = local_40;
  pRVar6 = local_40->node;
  pRVar6->type = Object;
  pRVar6->object = pOVar11;
  if ((((pRVar6->group->storage->marking)._M_base._M_i & 1U) != 0) &&
     (pOVar11->gcGeneration !=
      (pRVar6->group->storage->gcGeneration).super___atomic_base<unsigned_int>._M_i)) {
    pSVar7 = pRVar6->group->storage;
    do {
      LOCK();
      pSVar1 = &pSVar7->lockGcTargets;
      _Var4 = (pSVar1->flag).super___atomic_flag_base._M_i;
      (pSVar1->flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var4 != false);
    pSVar8 = pRVar6->group->storage;
    ppOVar9 = (pSVar8->gcTargets).
              super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppOVar9 ==
        (pSVar8->gcTargets).super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_38._M_h = (__hashtable_alloc *)pOVar11;
      std::deque<chatra::Object*,std::allocator<chatra::Object*>>::
      _M_push_back_aux<chatra::Object*const&>
                ((deque<chatra::Object*,std::allocator<chatra::Object*>> *)&pSVar8->gcTargets,
                 (Object **)&local_38);
    }
    else {
      *ppOVar9 = pOVar11;
      piVar2 = &(pSVar8->gcTargets).
                super__Deque_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar2->_M_cur = piVar2->_M_cur + 1;
    }
    (pSVar7->lockGcTargets).flag.super___atomic_flag_base._M_i = false;
  }
  local_38._M_h = (__hashtable_alloc *)pRVar10->node->object;
  pSVar7 = pRVar10->node->group->storage;
  do {
    LOCK();
    _Var4 = (pSVar7->lockObjects).flag.super___atomic_flag_base._M_i;
    (pSVar7->lockObjects).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var4 != false);
  puVar12 = (pSVar7->recycledObjectIndexes).
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (puVar12 ==
      (pSVar7->recycledObjectIndexes).
      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    __position._M_current =
         (pSVar7->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ((Object *)local_38._M_h)->objectIndex =
         (long)__position._M_current -
         (long)(pSVar7->objects).
               super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    if (__position._M_current ==
        (pSVar7->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chatra::Object*,std::allocator<chatra::Object*>>::
      _M_realloc_insert<chatra::Object*const&>
                ((vector<chatra::Object*,std::allocator<chatra::Object*>> *)&pSVar7->objects,
                 __position,(Object **)&local_38);
    }
    else {
      *__position._M_current = (Object *)local_38._M_h;
      pppOVar3 = &(pSVar7->objects).
                  super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar3 = *pppOVar3 + 1;
    }
  }
  else {
    if (puVar12 ==
        (pSVar7->recycledObjectIndexes).
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      puVar12 = (pSVar7->recycledObjectIndexes).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ((Object *)local_38._M_h)->objectIndex = puVar12[-1];
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              (&pSVar7->recycledObjectIndexes);
    (pSVar7->objects).super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>.
    _M_impl.super__Vector_impl_data._M_start[*(size_t *)(local_38._M_h + 0x18)] =
         (Object *)local_38._M_h;
  }
  (pSVar7->lockObjects).flag.super___atomic_flag_base._M_i = false;
  *(__int_type_conflict2 *)(local_38._M_h + 0x20) =
       (pSVar7->gcGeneration).super___atomic_base<unsigned_int>._M_i;
  return pOVar11;
}

Assistant:

Type& Reference::allocateWithoutLock(Args&&... args) const {
	chatra_assert(node != nullptr);
	Type* object = new Type(node->group.storage, std::forward<Args>(args)...);
	node->setObject(object);
	node->group.storage.registerObject(node->object);
	return *object;
}